

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTreeItemPtr_conflict
xmlSchemaParseModelGroup
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlSchemaTypeType type,
          int withParticle)

{
  long lVar1;
  xmlAttrPtr node_00;
  xmlSchemaPtr actxt;
  int iVar2;
  xmlSchemaAnnotPtr pxVar3;
  xmlChar *pxVar4;
  bool bVar5;
  xmlChar *local_90;
  xmlChar *str_1;
  xmlChar *str;
  xmlSchemaTreeItemPtr_conflict last_1;
  xmlSchemaTreeItemPtr_conflict part_1;
  xmlSchemaParticlePtr last;
  xmlSchemaParticlePtr part;
  int hasRefs;
  int isElemRef;
  int max;
  int min;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaParticlePtr particle;
  xmlSchemaModelGroupPtr item;
  int withParticle_local;
  xmlSchemaTypeType type_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  child = (xmlNodePtr)0x0;
  attr = (xmlAttrPtr)0x0;
  isElemRef = 1;
  hasRefs = 1;
  part._0_4_ = 0;
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  item._0_4_ = withParticle;
  item._4_4_ = type;
  _withParticle_local = node;
  node_local = (xmlNodePtr)schema;
  schema_local = (xmlSchemaPtr)ctxt;
  particle = (xmlSchemaParticlePtr)xmlSchemaAddModelGroup(ctxt,schema,type,node);
  if (particle == (xmlSchemaParticlePtr)0x0) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  if ((int)item == 0) {
    for (_max = _withParticle_local->properties; _max != (_xmlAttr *)0x0; _max = _max->next) {
      if (_max->ns == (xmlNs *)0x0) {
        iVar2 = xmlStrEqual(_max->name,"id");
        if (iVar2 == 0) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,_max);
        }
      }
      else {
        iVar2 = xmlStrEqual(_max->ns->href,xmlSchemaNs);
        if (iVar2 != 0) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,_max);
        }
      }
    }
  }
  else {
    if (item._4_4_ == XML_SCHEMA_TYPE_ALL) {
      isElemRef = xmlGetMinOccurs((xmlSchemaParserCtxtPtr)schema_local,_withParticle_local,0,1,1,
                                  "(0 | 1)");
      hasRefs = xmlGetMaxOccurs((xmlSchemaParserCtxtPtr)schema_local,_withParticle_local,1,1,1,"1");
    }
    else {
      isElemRef = xmlGetMinOccurs((xmlSchemaParserCtxtPtr)schema_local,_withParticle_local,0,-1,1,
                                  "xs:nonNegativeInteger");
      hasRefs = xmlGetMaxOccurs((xmlSchemaParserCtxtPtr)schema_local,_withParticle_local,0,
                                0x40000000,1,"(xs:nonNegativeInteger | unbounded)");
    }
    xmlSchemaPCheckParticleCorrect_2
              ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaParticlePtr)0x0,_withParticle_local,
               isElemRef,hasRefs);
    child = (xmlNodePtr)
            xmlSchemaAddParticle
                      ((xmlSchemaParserCtxtPtr)schema_local,_withParticle_local,isElemRef,hasRefs);
    if (child == (xmlNodePtr)0x0) {
      return (xmlSchemaTreeItemPtr_conflict)0x0;
    }
    child->children = (_xmlNode *)particle;
    for (_max = _withParticle_local->properties; _max != (_xmlAttr *)0x0; _max = _max->next) {
      if (_max->ns == (xmlNs *)0x0) {
        iVar2 = xmlStrEqual(_max->name,"id");
        if (((iVar2 == 0) && (iVar2 = xmlStrEqual(_max->name,(xmlChar *)"maxOccurs"), iVar2 == 0))
           && (iVar2 = xmlStrEqual(_max->name,(xmlChar *)"minOccurs"), iVar2 == 0)) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,_max);
        }
      }
      else {
        iVar2 = xmlStrEqual(_max->ns->href,xmlSchemaNs);
        if (iVar2 != 0) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,_max);
        }
      }
    }
  }
  xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,_withParticle_local,"id");
  attr = (xmlAttrPtr)_withParticle_local->children;
  if ((((_xmlNode *)attr != (_xmlNode *)0x0) && (((_xmlNode *)attr)->ns != (xmlNs *)0x0)) &&
     ((iVar2 = xmlStrEqual(((_xmlNode *)attr)->name,(xmlChar *)"annotation"), iVar2 != 0 &&
      (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 != 0)))) {
    pxVar3 = xmlSchemaParseAnnotation((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attr,1);
    particle->annot = pxVar3;
    attr = attr->next;
  }
  if (item._4_4_ != XML_SCHEMA_TYPE_ALL) {
    last_1 = (xmlSchemaTreeItemPtr_conflict)0x0;
    str = (xmlChar *)0x0;
    do {
      if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
         (iVar2 = xmlStrEqual(attr->name,"element"), iVar2 == 0)) {
LAB_001e2f1c:
        if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
           (iVar2 = xmlStrEqual(attr->name,"group"), iVar2 != 0)) {
          iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
          bVar5 = true;
          if (iVar2 != 0) goto LAB_001e308f;
        }
        if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
           (iVar2 = xmlStrEqual(attr->name,"any"), iVar2 != 0)) {
          iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
          bVar5 = true;
          if (iVar2 != 0) goto LAB_001e308f;
        }
        if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
           (iVar2 = xmlStrEqual(attr->name,(xmlChar *)"choice"), iVar2 != 0)) {
          iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
          bVar5 = true;
          if (iVar2 != 0) goto LAB_001e308f;
        }
        bVar5 = false;
        if ((attr != (xmlAttrPtr)0x0) && (bVar5 = false, attr->ns != (xmlNs *)0x0)) {
          iVar2 = xmlStrEqual(attr->name,(xmlChar *)"sequence");
          bVar5 = false;
          if (iVar2 != 0) {
            iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
            bVar5 = iVar2 != 0;
          }
        }
      }
      else {
        iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
        bVar5 = true;
        if (iVar2 == 0) goto LAB_001e2f1c;
      }
LAB_001e308f:
      if (!bVar5) goto LAB_001e354e;
      if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
         ((iVar2 = xmlStrEqual(attr->name,"element"), iVar2 == 0 ||
          (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)))) {
        if ((((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
            (iVar2 = xmlStrEqual(attr->name,"group"), iVar2 == 0)) ||
           (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)) {
          if ((((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
              (iVar2 = xmlStrEqual(attr->name,"any"), iVar2 == 0)) ||
             (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)) {
            if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
               ((iVar2 = xmlStrEqual(attr->name,(xmlChar *)"choice"), iVar2 == 0 ||
                (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)))) {
              if ((((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
                  (iVar2 = xmlStrEqual(attr->name,(xmlChar *)"sequence"), iVar2 != 0)) &&
                 (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 != 0)) {
                last_1 = xmlSchemaParseModelGroup
                                   ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                    (xmlNodePtr)attr,XML_SCHEMA_TYPE_SEQUENCE,1);
              }
            }
            else {
              last_1 = xmlSchemaParseModelGroup
                                 ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                  (xmlNodePtr)attr,XML_SCHEMA_TYPE_CHOICE,1);
            }
          }
          else {
            last_1 = (xmlSchemaTreeItemPtr_conflict)
                     xmlSchemaParseAny((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local
                                       ,(xmlNodePtr)attr);
          }
        }
        else {
          last_1 = xmlSchemaParseModelGroupDefRef
                             ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                              (xmlNodePtr)attr);
          actxt = schema_local;
          node_00 = attr;
          if (last_1 != (xmlSchemaTreeItemPtr_conflict)0x0) {
            part._0_4_ = (int)part + 1;
          }
          if ((((*(int *)((long)&schema_local[1].id + 4) != 0) &&
               (schema_local[1].typeDecl != (xmlHashTablePtr)0x0)) &&
              (((**(int **)&(schema_local[1].typeDecl)->size == 0x11 &&
                ((last_1 != (xmlSchemaTreeItemPtr_conflict)0x0 &&
                 (last_1->children != (xmlSchemaTreeItemPtr)0x0)))) &&
               ((xmlHashEntry *)last_1->children->children == schema_local[1].typeDecl[1].table))))
             && (lVar1._0_4_ = schema_local[1].typeDecl[1].size,
                lVar1._4_4_ = schema_local[1].typeDecl[1].nbElems,
                *(long *)(last_1->children + 1) == lVar1)) {
            if (*(int *)&schema_local[1].attrDecl == 0) {
              if ((last_1[1].type != XML_SCHEMA_TYPE_BASIC) || (*(int *)&last_1[1].field_0x4 != 1))
              {
                local_90 = (xmlChar *)0x0;
                pxVar4 = xmlSchemaFormatQName
                                   (&local_90,*(xmlChar **)&schema_local[1].typeDecl[1].size,
                                    (xmlChar *)schema_local[1].typeDecl[1].table);
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)actxt,XML_SCHEMAP_SRC_REDEFINE,
                                   (xmlNodePtr)node_00,(xmlSchemaBasicItemPtr)0x0,
                                   "The redefining model group definition \'%s\' must not contain a reference to the redefined definition with a maxOccurs/minOccurs other than 1"
                                   ,pxVar4,(xmlChar *)0x0);
                if (local_90 != (xmlChar *)0x0) {
                  (*xmlFree)(local_90);
                  local_90 = (xmlChar *)0x0;
                }
                last_1 = (xmlSchemaTreeItemPtr_conflict)0x0;
              }
            }
            else {
              str_1 = (xmlChar *)0x0;
              pxVar4 = xmlSchemaFormatQName
                                 (&str_1,*(xmlChar **)&schema_local[1].typeDecl[1].size,
                                  (xmlChar *)schema_local[1].typeDecl[1].table);
              xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)actxt,XML_SCHEMAP_SRC_REDEFINE,
                                 (xmlNodePtr)node_00,(xmlSchemaBasicItemPtr)0x0,
                                 "The redefining model group definition \'%s\' must not contain more than one reference to the redefined definition"
                                 ,pxVar4,(xmlChar *)0x0);
              if (str_1 != (xmlChar *)0x0) {
                (*xmlFree)(str_1);
                str_1 = (xmlChar *)0x0;
              }
              last_1 = (xmlSchemaTreeItemPtr_conflict)0x0;
            }
            (schema_local[1].typeDecl)->dict = (xmlDictPtr)last_1;
            *(int *)&schema_local[1].attrDecl = *(int *)&schema_local[1].attrDecl + 1;
          }
        }
      }
      else {
        last_1 = (xmlSchemaTreeItemPtr_conflict)
                 xmlSchemaParseElement
                           ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                            (xmlNodePtr)attr,(int *)((long)&part + 4),0);
        if ((last_1 != (xmlSchemaTreeItemPtr_conflict)0x0) && (part._4_4_ != 0)) {
          part._0_4_ = (int)part + 1;
        }
      }
      if (last_1 != (xmlSchemaTreeItemPtr_conflict)0x0) {
        if (str == (xmlChar *)0x0) {
          particle->children = last_1;
        }
        else {
          *(xmlSchemaTreeItemPtr_conflict *)(str + 0x10) = last_1;
        }
        str = (xmlChar *)last_1;
      }
      attr = attr->next;
    } while( true );
  }
  part_1 = (xmlSchemaTreeItemPtr_conflict)0x0;
  while( true ) {
    bVar5 = false;
    if ((attr != (xmlAttrPtr)0x0) && (bVar5 = false, attr->ns != (xmlNs *)0x0)) {
      iVar2 = xmlStrEqual(attr->name,"element");
      bVar5 = false;
      if (iVar2 != 0) {
        iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
        bVar5 = iVar2 != 0;
      }
    }
    if (!bVar5) break;
    last = (xmlSchemaParticlePtr)
           xmlSchemaParseElement
                     ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,(xmlNodePtr)attr
                      ,(int *)((long)&part + 4),0);
    if (last != (xmlSchemaParticlePtr)0x0) {
      if (part._4_4_ != 0) {
        part._0_4_ = (int)part + 1;
      }
      if (1 < last->minOccurs) {
        xmlSchemaPCustomErr((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_COS_ALL_LIMITED,
                            (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)attr,
                            "Invalid value for minOccurs (must be 0 or 1)",(xmlChar *)0x0);
        last->minOccurs = 1;
      }
      if (1 < last->maxOccurs) {
        xmlSchemaPCustomErr((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_COS_ALL_LIMITED,
                            (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)attr,
                            "Invalid value for maxOccurs (must be 0 or 1)",(xmlChar *)0x0);
        last->maxOccurs = 1;
      }
      if (part_1 == (xmlSchemaTreeItemPtr_conflict)0x0) {
        particle->children = (xmlSchemaTreeItemPtr_conflict)last;
      }
      else {
        part_1->next = (xmlSchemaTreeItemPtr)last;
      }
      part_1 = (xmlSchemaTreeItemPtr_conflict)last;
    }
    attr = attr->next;
  }
  if (attr != (xmlAttrPtr)0x0) {
    xmlSchemaPContentErr
              ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
               (xmlSchemaBasicItemPtr)0x0,_withParticle_local,(xmlNodePtr)attr,(char *)0x0,
               "(annotation?, (annotation?, element*)");
  }
LAB_001e3580:
  if ((hasRefs == 0) && (isElemRef == 0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    if (((int)part != 0) &&
       ((particle != (xmlSchemaParticlePtr)0x0 &&
        (iVar2 = xmlSchemaAddItemSize
                           ((xmlSchemaItemListPtr *)(*(long *)&schema_local->flags + 0x28),10,
                            particle), iVar2 < 0)))) {
      xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)schema_local);
    }
    if ((int)item == 0) {
      ctxt_local = (xmlSchemaParserCtxtPtr)particle;
    }
    else {
      ctxt_local = (xmlSchemaParserCtxtPtr)child;
    }
  }
  return (xmlSchemaTreeItemPtr_conflict)ctxt_local;
LAB_001e354e:
  if (attr != (xmlAttrPtr)0x0) {
    xmlSchemaPContentErr
              ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
               (xmlSchemaBasicItemPtr)0x0,_withParticle_local,(xmlNodePtr)attr,(char *)0x0,
               "(annotation?, (element | group | choice | sequence | any)*)");
  }
  goto LAB_001e3580;
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaParseModelGroup(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
			 xmlNodePtr node, xmlSchemaTypeType type,
			 int withParticle)
{
    xmlSchemaModelGroupPtr item;
    xmlSchemaParticlePtr particle = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int min = 1, max = 1, isElemRef, hasRefs = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /*
    * Create a model group with the given compositor.
    */
    item = xmlSchemaAddModelGroup(ctxt, schema, type, node);
    if (item == NULL)
	return (NULL);

    if (withParticle) {
	if (type == XML_SCHEMA_TYPE_ALL) {
	    min = xmlGetMinOccurs(ctxt, node, 0, 1, 1, "(0 | 1)");
	    max = xmlGetMaxOccurs(ctxt, node, 1, 1, 1, "1");
	} else {
	    /* choice + sequence */
	    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
	    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
		"(xs:nonNegativeInteger | unbounded)");
	}
	xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
	/*
	* Create a particle
	*/
	particle = xmlSchemaAddParticle(ctxt, node, min, max);
	if (particle == NULL)
	    return (NULL);
	particle->children = (xmlSchemaTreeItemPtr) item;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    }

    /*
    * Extract and validate attributes.
    */
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (type == XML_SCHEMA_TYPE_ALL) {
	xmlSchemaParticlePtr part, last = NULL;

	while (IS_SCHEMA(child, "element")) {
	    part = (xmlSchemaParticlePtr) xmlSchemaParseElement(ctxt,
		schema, child, &isElemRef, 0);
	    /*
	    * SPEC cos-all-limited (2)
	    * "The {max occurs} of all the particles in the {particles}
	    * of the ('all') group must be 0 or 1.
	    */
	    if (part != NULL) {
		if (isElemRef)
		    hasRefs++;
		if (part->minOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for minOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->minOccurs = 1;
		}
		if (part->maxOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for maxOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->maxOccurs = 1;
		}
		if (last == NULL)
		    item->children = (xmlSchemaTreeItemPtr) part;
		else
		    last->next = (xmlSchemaTreeItemPtr) part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (annotation?, element*)");
	}
    } else {
	/* choice + sequence */
	xmlSchemaTreeItemPtr part = NULL, last = NULL;

	while ((IS_SCHEMA(child, "element")) ||
	    (IS_SCHEMA(child, "group")) ||
	    (IS_SCHEMA(child, "any")) ||
	    (IS_SCHEMA(child, "choice")) ||
	    (IS_SCHEMA(child, "sequence"))) {

	    if (IS_SCHEMA(child, "element")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseElement(ctxt, schema, child, &isElemRef, 0);
		if (part && isElemRef)
		    hasRefs++;
	    } else if (IS_SCHEMA(child, "group")) {
		part =
		    xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
		if (part != NULL)
		    hasRefs++;
		/*
		* Handle redefinitions.
		*/
		if (ctxt->isRedefine && ctxt->redef &&
		    (ctxt->redef->item->type == XML_SCHEMA_TYPE_GROUP) &&
		    part && part->children)
		{
		    if ((xmlSchemaGetQNameRefName(part->children) ==
			    ctxt->redef->refName) &&
			(xmlSchemaGetQNameRefTargetNs(part->children) ==
			    ctxt->redef->refTargetNs))
		    {
			/*
			* SPEC src-redefine:
			* (6.1) "If it has a <group> among its contents at
			* some level the `actual value` of whose ref
			* [attribute] is the same as the `actual value` of
			* its own name attribute plus target namespace, then
			* all of the following must be true:"
			* (6.1.1) "It must have exactly one such group."
			*/
			if (ctxt->redefCounter != 0) {
			    xmlChar *str = NULL;

			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain more than one "
				"reference to the redefined definition",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			} else if (((WXS_PARTICLE(part))->minOccurs != 1) ||
			    ((WXS_PARTICLE(part))->maxOccurs != 1))
			{
			    xmlChar *str = NULL;
			    /*
			    * SPEC src-redefine:
			    * (6.1.2) "The `actual value` of both that
			    * group's minOccurs and maxOccurs [attribute]
			    * must be 1 (or `absent`).
			    */
			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain a reference to the "
				"redefined definition with a "
				"maxOccurs/minOccurs other than 1",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			}
			ctxt->redef->reference = WXS_BASIC_CAST part;
			ctxt->redefCounter++;
		    }
		}
	    } else if (IS_SCHEMA(child, "any")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseAny(ctxt, schema, child);
	    } else if (IS_SCHEMA(child, "choice")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
	    } else if (IS_SCHEMA(child, "sequence")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
	    }
	    if (part != NULL) {
		if (last == NULL)
		    item->children = part;
		else
		    last->next = part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (element | group | choice | sequence | any)*)");
	}
    }
    if ((max == 0) && (min == 0))
	return (NULL);
    if (hasRefs) {
	/*
	* We need to resolve references.
	*/
	WXS_ADD_PENDING(ctxt, item);
    }
    if (withParticle)
	return ((xmlSchemaTreeItemPtr) particle);
    else
	return ((xmlSchemaTreeItemPtr) item);
}